

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cpp
# Opt level: O2

hash_t duckdb::HashBytes<false>(const_data_ptr_t ptr,idx_t len)

{
  hash_t hVar1;
  ulong uVar2;
  ulong __n;
  uint64_t x;
  hash_t hr;
  ulong local_20;
  
  x = len * -0x395b586ca42e166b ^ 0xe17a1465;
  __n = (ulong)((uint)len & 7);
  for (uVar2 = 0; (len & 0xfffffffffffffff8) != uVar2; uVar2 = uVar2 + 8) {
    x = (x ^ *(ulong *)(ptr + uVar2)) * -0x2917014799a6026d;
  }
  if (__n != 0) {
    local_20 = 0;
    switchD_00916250::default(&local_20,ptr + (len & 0xfffffffffffffff8),__n);
    x = (x ^ local_20) * -0x2917014799a6026d;
  }
  hVar1 = MurmurHash64(x);
  return hVar1;
}

Assistant:

hash_t HashBytes(const_data_ptr_t ptr, const idx_t len) noexcept {
	// This seed slightly improves bit distribution, taken from here:
	// https://github.com/martinus/robin-hood-hashing/blob/3.11.5/LICENSE
	// MIT License Copyright (c) 2018-2021 Martin Ankerl
	hash_t h = 0xe17a1465U ^ (len * 0xc6a4a7935bd1e995U);

	// Hash/combine in blocks of 8 bytes
	const auto remainder = len & 7U;
	for (const auto end = ptr + len - remainder; ptr != end; ptr += 8U) {
		h ^= Load<hash_t>(ptr);
		h *= 0xd6e8feb86659fd93U;
	}

	if (remainder != 0) {
		if (AT_LEAST_8_BYTES) {
			D_ASSERT(len >= 8);
			// Load remaining (<8) bytes (with a Load instead of a memcpy)
			const auto inv_rem = 8U - remainder;
			const auto hr = Load<hash_t>(ptr - inv_rem) >> (inv_rem * 8U);

			h ^= hr;
			h *= 0xd6e8feb86659fd93U;
		} else {
			// Load remaining (<8) bytes (with a memcpy)
			hash_t hr = 0;
			memcpy(&hr, ptr, remainder);

			h ^= hr;
			h *= 0xd6e8feb86659fd93U;
		}
	}

	// Finalize
	return Hash(h);
}